

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscReader.cpp
# Opt level: O2

void __thiscall
adios2::core::engine::SscReader::DoGetStructSync
          (SscReader *this,VariableStruct *variable,void *data)

{
  element_type *peVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  allocator local_8b;
  allocator local_8a;
  allocator local_89;
  ScopedTimer __var2139;
  string local_80 [32];
  string local_60 [32];
  string local_40 [32];
  
  if (DoGetStructSync(adios2::core::VariableStruct&,void*)::__var139 == '\0') {
    iVar2 = __cxa_guard_acquire(&DoGetStructSync(adios2::core::VariableStruct&,void*)::__var139);
    if (iVar2 != 0) {
      uVar4 = ps_make_timer_name_("/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/engine/ssc/SscReader.cpp"
                                  ,
                                  "virtual void adios2::core::engine::SscReader::DoGetStructSync(VariableStruct &, void *)"
                                  ,0x8b);
      DoGetStructSync::__var139 = (void *)ps_timer_create_(uVar4);
      __cxa_guard_release(&DoGetStructSync(adios2::core::VariableStruct&,void*)::__var139);
    }
  }
  external::perfstubs_profiler::ScopedTimer::ScopedTimer(&__var2139,DoGetStructSync::__var139);
  std::__cxx11::string::string(local_40,"Engine",&local_89);
  std::__cxx11::string::string(local_60,"SscReader",&local_8a);
  std::__cxx11::string::string(local_80,"GetSync",&local_8b);
  iVar2 = 0;
  if (9 < this->m_Verbosity) {
    iVar2 = adios2::helper::Comm::Rank();
  }
  iVar3 = adios2::helper::Comm::Rank();
  adios2::helper::Log(local_40,local_60,local_80,(string *)(variable + 8),iVar2,iVar3,5,
                      this->m_Verbosity,INFO);
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_40);
  peVar1 = (this->m_EngineInstance).
           super___shared_ptr<adios2::core::engine::ssc::SscReaderBase,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (*peVar1->_vptr_SscReaderBase[0x17])(peVar1,variable,data);
  (*((this->m_EngineInstance).
     super___shared_ptr<adios2::core::engine::ssc::SscReaderBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    )->_vptr_SscReaderBase[4])();
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer(&__var2139);
  return;
}

Assistant:

void SscReader::DoGetStructSync(VariableStruct &variable, void *data)
{
    PERFSTUBS_SCOPED_TIMER_FUNC();
    helper::Log("Engine", "SscReader", "GetSync", variable.m_Name,
                m_Verbosity >= 10 ? m_Comm.Rank() : 0, m_Comm.Rank(), 5, m_Verbosity,
                helper::LogMode::INFO);
    m_EngineInstance->GetDeferred(variable, data);
    m_EngineInstance->PerformGets();
}